

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentBuilder * __thiscall capnp::_::BuilderArena::getSegment(BuilderArena *this,SegmentId id)

{
  bool bVar1;
  uint uVar2;
  MultiSegmentState *pMVar3;
  size_t sVar4;
  Own<capnp::_::SegmentBuilder> *this_00;
  Fault local_50;
  Fault f_1;
  Fault local_38;
  Fault f;
  Own<capnp::_::BuilderArena::MultiSegmentState> *s;
  BuilderArena *local_20;
  BuilderArena *this_local;
  SegmentBuilder *pSStack_10;
  SegmentId id_local;
  
  local_20 = this;
  this_local._4_4_ = id.value;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)((long)&s + 4),0);
  bVar1 = kj::Id<unsigned_int,_capnp::_::Segment>::operator==
                    ((Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),
                     (Id<unsigned_int,_capnp::_::Segment> *)((long)&s + 4));
  if (bVar1) {
    pSStack_10 = &this->segment0;
  }
  else {
    f.exception = (Exception *)
                  kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState>(&this->moreSegments);
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xb1,FAILED,(char *)0x0,"\"invalid segment id\", id.value",
                 (char (*) [19])"invalid segment id",(uint *)((long)&this_local + 4));
      kj::_::Debug::Fault::fatal(&local_50);
    }
    uVar2 = this_local._4_4_ - 1;
    pMVar3 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    sVar4 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::size(&pMVar3->builders);
    if (sVar4 <= uVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xae,FAILED,"id.value - 1 < s->get()->builders.size()",
                 "\"invalid segment id\", id.value",(char (*) [19])"invalid segment id",
                 (uint *)((long)&this_local + 4));
      kj::_::Debug::Fault::fatal(&local_38);
    }
    pMVar3 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    this_00 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::operator[]
                        (&pMVar3->builders,(ulong)(this_local._4_4_ - 1));
    pSStack_10 = kj::Own<capnp::_::SegmentBuilder>::get(this_00);
  }
  return pSStack_10;
}

Assistant:

SegmentBuilder* BuilderArena::getSegment(SegmentId id) {
  // This method is allowed to fail if the segment ID is not valid.
  if (id == SegmentId(0)) {
    return &segment0;
  } else {
    KJ_IF_MAYBE(s, moreSegments) {
      KJ_REQUIRE(id.value - 1 < s->get()->builders.size(), "invalid segment id", id.value);
      return const_cast<SegmentBuilder*>(s->get()->builders[id.value - 1].get());
    } else {
      KJ_FAIL_REQUIRE("invalid segment id", id.value);
    }
  }